

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_traversal_predictive_encoder.h
# Opt level: O0

int32_t __thiscall
draco::MeshEdgebreakerTraversalPredictiveEncoder::ComputePredictedSymbol
          (MeshEdgebreakerTraversalPredictiveEncoder *this,VertexIndex pivot)

{
  uint uVar1;
  reference pvVar2;
  long in_RDI;
  int valence;
  IndexType<unsigned_int,_draco::VertexIndex_tag_type_> local_8;
  int32_t local_4;
  
  uVar1 = IndexType<unsigned_int,_draco::VertexIndex_tag_type_>::value(&local_8);
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xa0),(ulong)uVar1);
  if (*pvVar2 < 0) {
    local_4 = 9;
  }
  else if (*pvVar2 < 6) {
    local_4 = 5;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

inline int32_t ComputePredictedSymbol(VertexIndex pivot) {
    const int valence = vertex_valences_[pivot.value()];
    if (valence < 0) {
      // This situation can happen only for split vertices. Returning
      // TOPOLOGY_INVALID always cases misprediction.
      return TOPOLOGY_INVALID;
    }
    if (valence < 6) {
      return TOPOLOGY_R;
    }
    return TOPOLOGY_C;
  }